

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O3

int duckdb_brotli::BrotliEncoderCompressStream
              (BrotliEncoderStateInternal *s,BrotliEncoderOperation op,size_t *available_in,
              uint8_t **next_in,size_t *available_out,uint8_t **next_out,size_t *total_out)

{
  MemoryManager *m;
  anon_union_16_2_c961180f_for_tiny_buf_ *__dest;
  size_t *out_size;
  undefined8 uVar1;
  uint8_t uVar2;
  bool bVar3;
  int iVar4;
  BrotliEncoderStreamState BVar5;
  ulong uVar6;
  BrotliOnePassArena *pBVar7;
  BrotliTwoPassArena *pBVar8;
  ulong uVar9;
  uint32_t *puVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  int *table;
  byte bVar13;
  bool bVar15;
  ushort uVar16;
  uint uVar17;
  long lVar18;
  size_t __n;
  ulong uVar19;
  uint64_t uVar20;
  uint uVar21;
  undefined8 *puVar22;
  ulong uVar23;
  ulong uVar24;
  uint8_t *puVar25;
  uint32_t uVar26;
  uint32_t uVar27;
  size_t n;
  uint uVar28;
  bool bVar29;
  byte bVar30;
  uint32_t *local_80;
  uint8_t *local_78;
  uint32_t *local_70;
  uint8_t *local_68;
  size_t storage_ix;
  uint local_40;
  BrotliEncoderStreamState local_3c;
  size_t local_38;
  byte bVar14;
  
  bVar30 = 0;
  m = &s->memory_manager_;
  if (s->is_initialized_ == 0) {
    s->last_bytes_ = 0;
    s->last_bytes_bits_ = '\0';
    s->flint_ = -2;
    s->remaining_metadata_bytes_ = 0xffffffff;
    uVar21 = (s->params).quality;
    uVar17 = 0;
    if (0 < (int)uVar21) {
      uVar17 = uVar21;
    }
    uVar28 = 0xb;
    if ((int)uVar17 < 0xb) {
      uVar28 = uVar17;
    }
    (s->params).quality = uVar28;
    if ((int)uVar21 < 3) {
      (s->params).large_window = 0;
    }
    uVar17 = (s->params).lgwin;
    uVar28 = 10;
    if ((int)uVar17 < 10) {
LAB_01cf5eff:
      uVar17 = uVar28;
      (s->params).lgwin = uVar17;
    }
    else {
      uVar28 = 0x1e;
      if ((s->params).large_window == 0) {
        uVar28 = 0x18;
      }
      if (uVar28 < uVar17) goto LAB_01cf5eff;
    }
    uVar28 = uVar17;
    if (((int)uVar21 < 2) || (uVar28 = 0xe, uVar21 < 4)) {
      (s->params).lgblock = uVar28;
LAB_01cf5f1e:
      uVar17 = 0;
      uVar21 = 0;
    }
    else {
      uVar28 = (s->params).lgblock;
      if (uVar28 == 0) {
        uVar28 = 0x10;
        if (((8 < uVar21) && (0x10 < uVar17)) && (uVar28 = 0x12, uVar17 < 0x12)) {
          uVar28 = uVar17;
        }
      }
      else {
        uVar21 = 0x10;
        if (0x10 < (int)uVar28) {
          uVar21 = uVar28;
        }
        uVar28 = 0x18;
        if ((int)uVar21 < 0x18) {
          uVar28 = uVar21;
        }
      }
      (s->params).lgblock = uVar28;
      if ((s->params).mode == BROTLI_MODE_FONT) {
        uVar21 = 1;
        uVar17 = 0xc;
      }
      else {
        uVar21 = (s->params).dist.distance_postfix_bits;
        uVar17 = (s->params).dist.num_direct_distance_codes;
      }
      if ((0x78 < uVar17 || 3 < uVar21) ||
         ((uVar17 >> ((byte)uVar21 & 0x1f) & 0xf) << ((byte)uVar21 & 0x1f) != uVar17))
      goto LAB_01cf5f1e;
    }
    BrotliInitDistanceParams(&(s->params).dist,uVar21,uVar17,(s->params).large_window);
    uVar9 = (s->params).stream_offset;
    if (uVar9 != 0) {
      s->flint_ = '\x02';
      s->dist_cache_[0] = -0x10;
      s->dist_cache_[1] = -0x10;
      s->dist_cache_[2] = -0x10;
      s->dist_cache_[3] = -0x10;
      uVar1 = *(undefined8 *)(s->dist_cache_ + 2);
      *(undefined8 *)s->saved_dist_cache_ = *(undefined8 *)s->dist_cache_;
      *(undefined8 *)(s->saved_dist_cache_ + 2) = uVar1;
    }
    uVar21 = (s->params).lgwin;
    iVar4 = (s->params).lgblock;
    bVar13 = (byte)iVar4;
    bVar14 = bVar13;
    if (iVar4 < (int)uVar21) {
      bVar14 = (byte)uVar21;
    }
    uVar26 = 1 << (bVar14 + 1 & 0x1f);
    uVar17 = (s->params).quality;
    uVar27 = 1 << (bVar13 & 0x1f);
    uVar28 = 0x12;
    if (0x12 < (int)uVar21) {
      uVar28 = uVar21;
    }
    if (1 < uVar17) {
      uVar28 = uVar21;
    }
    (s->ringbuffer_).size_ = uVar26;
    (s->ringbuffer_).mask_ = uVar26 - 1;
    (s->ringbuffer_).tail_size_ = uVar27;
    (s->ringbuffer_).total_size_ = uVar26 + uVar27;
    if (uVar9 == 0) {
      if ((s->params).large_window == 0) {
        if (uVar28 == 0x10) {
          uVar2 = '\x01';
          uVar16 = 0;
        }
        else if (uVar28 == 0x11) {
          uVar2 = '\a';
          uVar16 = 1;
        }
        else if ((int)uVar28 < 0x12) {
          uVar16 = (short)uVar28 * 0x10 - 0x7f;
          uVar2 = '\a';
        }
        else {
          uVar16 = (short)uVar28 * 2 - 0x21;
          uVar2 = '\x04';
        }
      }
      else {
        uVar16 = (ushort)((uVar28 & 0x3f) << 8) | 0x11;
        uVar2 = '\x0e';
      }
      s->last_bytes_ = uVar16;
      s->last_bytes_bits_ = uVar2;
    }
    else {
      uVar6 = (1L << ((byte)uVar28 & 0x3f)) - 0x10;
      if (uVar9 < uVar6) {
        uVar6 = uVar9;
      }
      (s->params).stream_offset = uVar6;
    }
    if (uVar17 == 1) {
      pBVar8 = (BrotliTwoPassArena *)BrotliAllocate(m,0x1dc8);
      s->two_pass_arena_ = pBVar8;
    }
    else if (uVar17 == 0) {
      pBVar7 = (BrotliOnePassArena *)BrotliAllocate(m,0x1fd0);
      s->one_pass_arena_ = pBVar7;
      puVar22 = &InitCommandPrefixCodes(duckdb_brotli::BrotliOnePassArena*)::kDefaultCommandDepths;
      puVar12 = pBVar7->cmd_depth;
      for (lVar18 = 0x10; lVar18 != 0; lVar18 = lVar18 + -1) {
        *(undefined8 *)puVar12 = *puVar22;
        puVar22 = puVar22 + (ulong)bVar30 * -2 + 1;
        puVar12 = puVar12 + (ulong)bVar30 * -0x10 + 8;
      }
      switchD_012b9b0d::default
                (pBVar7->cmd_bits,
                 InitCommandPrefixCodes(duckdb_brotli::BrotliOnePassArena*)::kDefaultCommandBits,
                 0x100);
      pBVar7->cmd_code[0] = 0xff;
      pBVar7->cmd_code[1] = 'w';
      pBVar7->cmd_code[2] = 0xd5;
      pBVar7->cmd_code[3] = 0xbf;
      pBVar7->cmd_code[4] = 0xe7;
      pBVar7->cmd_code[5] = 0xde;
      pBVar7->cmd_code[6] = 0xea;
      pBVar7->cmd_code[7] = 0x9e;
      pBVar7->cmd_code[8] = 'Q';
      pBVar7->cmd_code[9] = ']';
      pBVar7->cmd_code[10] = 0xde;
      pBVar7->cmd_code[0xb] = 0xc6;
      pBVar7->cmd_code[0xc] = 'p';
      pBVar7->cmd_code[0xd] = 'W';
      pBVar7->cmd_code[0xe] = 0xbc;
      pBVar7->cmd_code[0xf] = 'X';
      pBVar7->cmd_code[0x10] = 'X';
      pBVar7->cmd_code[0x11] = 'X';
      pBVar7->cmd_code[0x12] = 0xd8;
      pBVar7->cmd_code[0x13] = 0xd8;
      pBVar7->cmd_code[0x14] = 'X';
      pBVar7->cmd_code[0x15] = 0xd5;
      pBVar7->cmd_code[0x16] = 0xcb;
      pBVar7->cmd_code[0x17] = 0x8c;
      pBVar7->cmd_code[0x18] = 0xea;
      pBVar7->cmd_code[0x19] = 0xe0;
      pBVar7->cmd_code[0x1a] = 0xc3;
      pBVar7->cmd_code[0x1b] = 0x87;
      pBVar7->cmd_code[0x1c] = '\x1f';
      pBVar7->cmd_code[0x1d] = 0x83;
      pBVar7->cmd_code[0x1e] = 0xc1;
      pBVar7->cmd_code[0x1f] = '`';
      pBVar7->cmd_code[0x20] = '\x1c';
      pBVar7->cmd_code[0x21] = 'g';
      pBVar7->cmd_code[0x22] = 0xb2;
      pBVar7->cmd_code[0x23] = 0xaa;
      pBVar7->cmd_code[0x24] = '\x06';
      pBVar7->cmd_code[0x25] = 0x83;
      pBVar7->cmd_code[0x26] = 0xc1;
      pBVar7->cmd_code[0x27] = '`';
      pBVar7->cmd_code[0x28] = '0';
      pBVar7->cmd_code[0x29] = '\x18';
      pBVar7->cmd_code[0x2a] = 0xcc;
      pBVar7->cmd_code[0x2b] = 0xa1;
      pBVar7->cmd_code[0x2c] = 0xce;
      pBVar7->cmd_code[0x2d] = 0x88;
      pBVar7->cmd_code[0x2e] = 'T';
      pBVar7->cmd_code[0x2f] = 0x94;
      pBVar7->cmd_code[0x29] = '\x18';
      pBVar7->cmd_code[0x2a] = 0xcc;
      pBVar7->cmd_code[0x2b] = 0xa1;
      pBVar7->cmd_code[0x2c] = 0xce;
      pBVar7->cmd_code[0x2d] = 0x88;
      pBVar7->cmd_code[0x2e] = 'T';
      pBVar7->cmd_code[0x2f] = 0x94;
      pBVar7->cmd_code[0x30] = 'F';
      pBVar7->cmd_code[0x31] = 0xe1;
      pBVar7->cmd_code[0x32] = 0xb0;
      pBVar7->cmd_code[0x33] = 0xd0;
      pBVar7->cmd_code[0x34] = 'N';
      pBVar7->cmd_code[0x35] = 0xb2;
      pBVar7->cmd_code[0x36] = 0xf7;
      pBVar7->cmd_code[0x37] = '\x04';
      pBVar7->cmd_code[0x38] = '\0';
      pBVar7->cmd_code_numbits = 0x1c0;
    }
    s->is_initialized_ = 1;
  }
  if ((ulong)s->remaining_metadata_bytes_ != 0xffffffff) {
    if (op != BROTLI_OPERATION_EMIT_METADATA) {
      return 0;
    }
    if (*available_in != (ulong)s->remaining_metadata_bytes_) {
      return 0;
    }
LAB_01cf60fd:
    if ((s->params).size_hint == 0) {
      uVar9 = s->input_pos_ - s->last_processed_pos_;
      if (0x3fffffff < uVar9) {
        uVar9 = 0x40000000;
      }
      (s->params).size_hint = uVar9;
    }
    if (*available_in < 0x1000001) {
      if (s->stream_state_ == BROTLI_STREAM_PROCESSING) {
        s->remaining_metadata_bytes_ = (uint32_t)*available_in;
        s->stream_state_ = BROTLI_STREAM_METADATA_HEAD;
      }
      else if (1 < s->stream_state_ - BROTLI_STREAM_METADATA_HEAD) {
        return 0;
      }
      __dest = &s->tiny_buf_;
      do {
        while( true ) {
          do {
            iVar4 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
          } while (iVar4 != 0);
          if (s->available_out_ != 0) {
            return 1;
          }
          if (s->input_pos_ != s->last_flush_pos_) break;
          if (s->stream_state_ == BROTLI_STREAM_METADATA_HEAD) {
            s->next_out_ = (uint8_t *)__dest;
            uVar21 = s->remaining_metadata_bytes_;
            uVar23 = (ulong)uVar21;
            bVar30 = s->last_bytes_bits_;
            uVar19 = (ulong)bVar30;
            *(uint16_t *)&s->tiny_buf_ = s->last_bytes_;
            s->last_bytes_ = 0;
            s->last_bytes_bits_ = '\0';
            *(ulong *)((long)&s->tiny_buf_ + (ulong)(bVar30 >> 3)) =
                 (ulong)(s->tiny_buf_).u8[bVar30 >> 3];
            uVar6 = uVar19 + 1 >> 3;
            uVar24 = (ulong)(bVar30 + 3 >> 3);
            uVar9 = uVar19 + 4;
            *(ulong *)((long)&s->tiny_buf_ + uVar6) =
                 3L << ((byte)(uVar19 + 1) & 7) | (ulong)(s->tiny_buf_).u8[uVar6];
            *(ulong *)((long)&s->tiny_buf_ + uVar24) = (ulong)(s->tiny_buf_).u8[uVar24];
            if (uVar23 == 1) {
LAB_01cf6499:
              uVar6 = uVar19 + (ulong)uVar21 * 8;
              *(ulong *)((long)__dest + (uVar9 >> 3)) =
                   (ulong)uVar21 << ((byte)uVar9 & 7) | (ulong)__dest->u8[uVar9 >> 3];
              uVar9 = uVar19 + 6 >> 3;
              *(ulong *)((long)__dest + uVar9) =
                   uVar23 - 1 << ((byte)(uVar19 + 6) & 7) | (ulong)__dest->u8[uVar9];
            }
            else {
              if (uVar21 != 0) {
                uVar17 = 0x1f;
                if (uVar21 - 1 != 0) {
                  for (; uVar21 - 1 >> uVar17 == 0; uVar17 = uVar17 - 1) {
                  }
                }
                uVar21 = (uVar17 ^ 0xffffffe0) + 0x28 >> 3;
                goto LAB_01cf6499;
              }
              *(ulong *)((long)__dest + (uVar9 >> 3)) = (ulong)__dest->u8[uVar9 >> 3];
              uVar6 = uVar19;
            }
            s->available_out_ = uVar6 + 0xd >> 3;
            s->stream_state_ = BROTLI_STREAM_METADATA_BODY;
          }
          else {
            uVar21 = s->remaining_metadata_bytes_;
            uVar9 = (ulong)uVar21;
            if (uVar9 == 0) {
              s->remaining_metadata_bytes_ = 0xffffffff;
              s->stream_state_ = BROTLI_STREAM_PROCESSING;
              return 1;
            }
            uVar6 = *available_out;
            if (uVar6 == 0) {
              if (0xf < uVar21) {
                uVar21 = 0x10;
              }
              uVar9 = (ulong)uVar21;
              s->next_out_ = (uint8_t *)__dest;
              switchD_012b9b0d::default(__dest,*next_in,uVar9);
              *next_in = *next_in + uVar9;
              *available_in = *available_in - uVar9;
              s->total_in_ = s->total_in_ + uVar9;
              s->remaining_metadata_bytes_ = s->remaining_metadata_bytes_ - uVar21;
              s->available_out_ = uVar9;
            }
            else {
              if (uVar9 < uVar6) {
                uVar6 = uVar9;
              }
              switchD_012b9b0d::default(*next_out,*next_in,uVar6);
              *next_in = *next_in + uVar6;
              *available_in = *available_in - uVar6;
              s->total_in_ = s->total_in_ + uVar6;
              s->remaining_metadata_bytes_ = s->remaining_metadata_bytes_ - (int)uVar6;
              *next_out = *next_out + uVar6;
              *available_out = *available_out - uVar6;
            }
          }
        }
        iVar4 = EncodeData(s,0,1,&s->available_out_,&s->next_out_);
      } while (iVar4 != 0);
    }
    return 0;
  }
  if (op == BROTLI_OPERATION_EMIT_METADATA) goto LAB_01cf60fd;
  if (s->stream_state_ - BROTLI_STREAM_METADATA_HEAD < 2) {
    return 0;
  }
  if ((s->stream_state_ != BROTLI_STREAM_PROCESSING) && (*available_in != 0)) {
    return 0;
  }
  uVar21 = (s->params).quality;
  if (1 < uVar21) {
    out_size = &s->available_out_;
LAB_01cf6595:
    do {
      while( true ) {
        while( true ) {
          uVar6 = s->input_pos_ - s->last_processed_pos_;
          uVar23 = 1L << ((byte)(s->params).lgblock & 0x3f);
          uVar9 = uVar23 - uVar6;
          if (uVar23 < uVar6) {
            uVar9 = 0;
          }
          uVar23 = (ulong)s->flint_;
          uVar6 = uVar23;
          if (uVar9 < uVar23) {
            uVar6 = uVar9;
          }
          if ((long)uVar23 < 0) {
            uVar6 = uVar9;
          }
          if ((uVar6 == 0) || (uVar9 = *available_in, uVar9 == 0)) break;
          if (uVar6 < uVar9) {
            uVar9 = uVar6;
          }
          puVar12 = *next_in;
          uVar26 = (s->ringbuffer_).pos_;
          uVar21 = (uint)uVar9;
          if ((uVar26 == 0) && (uVar9 < (s->ringbuffer_).tail_size_)) {
            (s->ringbuffer_).pos_ = uVar21;
            puVar11 = (uint8_t *)BrotliAllocate(m,(ulong)(uVar21 + 2) + 7);
            puVar25 = (s->ringbuffer_).data_;
            if (puVar25 != (uint8_t *)0x0) {
              switchD_012b9b0d::default(puVar11,puVar25,(ulong)((s->ringbuffer_).cur_size_ + 2) + 7)
              ;
              BrotliFree(m,(s->ringbuffer_).data_);
            }
            (s->ringbuffer_).data_ = puVar11;
            (s->ringbuffer_).cur_size_ = uVar21;
            (s->ringbuffer_).buffer_ = puVar11 + 2;
            puVar11[1] = '\0';
            (s->ringbuffer_).buffer_[-2] = '\0';
            lVar18 = 0;
            do {
              (s->ringbuffer_).buffer_[lVar18 + (ulong)(s->ringbuffer_).cur_size_] = '\0';
              lVar18 = lVar18 + 1;
            } while (lVar18 != 7);
            switchD_012b9b0d::default((s->ringbuffer_).buffer_,puVar12,uVar9);
            uVar21 = (s->ringbuffer_).pos_;
          }
          else {
            uVar17 = (s->ringbuffer_).total_size_;
            if ((s->ringbuffer_).cur_size_ < uVar17) {
              puVar11 = (uint8_t *)BrotliAllocate(m,(ulong)(uVar17 + 2) + 7);
              puVar25 = (s->ringbuffer_).data_;
              if (puVar25 != (uint8_t *)0x0) {
                switchD_012b9b0d::default
                          (puVar11,puVar25,(ulong)((s->ringbuffer_).cur_size_ + 2) + 7);
                BrotliFree(m,(s->ringbuffer_).data_);
              }
              (s->ringbuffer_).data_ = puVar11;
              (s->ringbuffer_).cur_size_ = uVar17;
              (s->ringbuffer_).buffer_ = puVar11 + 2;
              puVar11[1] = '\0';
              (s->ringbuffer_).buffer_[-2] = '\0';
              lVar18 = 0;
              do {
                (s->ringbuffer_).buffer_[lVar18 + (ulong)(s->ringbuffer_).cur_size_] = '\0';
                lVar18 = lVar18 + 1;
              } while (lVar18 != 7);
              (s->ringbuffer_).buffer_[(s->ringbuffer_).size_ - 2] = '\0';
              (s->ringbuffer_).buffer_[(s->ringbuffer_).size_ - 1] = '\0';
              (s->ringbuffer_).buffer_[(s->ringbuffer_).size_] = 0xf1;
              uVar26 = (s->ringbuffer_).pos_;
            }
            uVar28 = uVar26 & (s->ringbuffer_).mask_;
            uVar23 = (ulong)uVar28;
            uVar6 = (ulong)(s->ringbuffer_).size_;
            uVar17 = (s->ringbuffer_).tail_size_;
            if (uVar28 < uVar17) {
              uVar19 = uVar17 - uVar23;
              if (uVar9 < uVar19) {
                uVar19 = uVar9;
              }
              switchD_012b9b0d::default((s->ringbuffer_).buffer_ + uVar23 + uVar6,puVar12,uVar19);
              uVar6 = (ulong)(s->ringbuffer_).size_;
            }
            puVar25 = (s->ringbuffer_).buffer_ + uVar23;
            __n = uVar9;
            if (uVar6 < uVar23 + uVar9) {
              uVar6 = (s->ringbuffer_).total_size_ - uVar23;
              if (uVar9 < uVar6) {
                uVar6 = uVar9;
              }
              switchD_012b9b0d::default(puVar25,puVar12,uVar6);
              puVar25 = (s->ringbuffer_).buffer_;
              lVar18 = (s->ringbuffer_).size_ - uVar23;
              puVar12 = puVar12 + lVar18;
              __n = uVar9 - lVar18;
            }
            switchD_012b9b0d::default(puVar25,puVar12,__n);
            puVar12 = (s->ringbuffer_).buffer_;
            uVar17 = (s->ringbuffer_).pos_;
            puVar12[-2] = puVar12[(s->ringbuffer_).size_ - 2];
            puVar12 = (s->ringbuffer_).buffer_;
            puVar12[-1] = puVar12[(s->ringbuffer_).size_ - 1];
            uVar21 = (uVar21 & 0x7fffffff) + ((s->ringbuffer_).pos_ & 0x7fffffff) |
                     uVar17 & 0x80000000;
            (s->ringbuffer_).pos_ = uVar21;
          }
          s->input_pos_ = s->input_pos_ + uVar9;
          if (uVar21 <= (s->ringbuffer_).mask_) {
            puVar12 = (s->ringbuffer_).buffer_;
            puVar25 = puVar12 + (ulong)uVar21 + 3;
            puVar25[0] = '\0';
            puVar25[1] = '\0';
            puVar25[2] = '\0';
            puVar25[3] = '\0';
            puVar12 = puVar12 + uVar21;
            puVar12[0] = '\0';
            puVar12[1] = '\0';
            puVar12[2] = '\0';
            puVar12[3] = '\0';
          }
          *next_in = *next_in + uVar9;
          *available_in = *available_in - uVar9;
          s->total_in_ = s->total_in_ + uVar9;
          if ('\0' < s->flint_) {
            s->flint_ = s->flint_ - (char)uVar9;
          }
        }
        iVar4 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
        if (iVar4 != 0) break;
        if (*out_size != 0) {
          return 1;
        }
        if (s->stream_state_ != BROTLI_STREAM_PROCESSING) {
          if (s->stream_state_ != BROTLI_STREAM_FLUSH_REQUESTED) {
            return 1;
          }
          goto LAB_01cf6dcd;
        }
        if ((op == BROTLI_OPERATION_PROCESS) && (uVar6 != 0)) {
          return 1;
        }
        uVar9 = *available_in;
        bVar29 = uVar9 == 0;
        bVar15 = op == BROTLI_OPERATION_FINISH && bVar29;
        bVar3 = op == BROTLI_OPERATION_FLUSH && bVar29;
        if ((op != BROTLI_OPERATION_FINISH || !bVar29) && (s->flint_ == '\0')) {
          s->flint_ = -1;
          bVar3 = true;
        }
        if ((s->params).size_hint == 0) {
          uVar6 = s->input_pos_ - s->last_processed_pos_;
          uVar23 = uVar6 + uVar9;
          if (0x3fffffff < uVar23) {
            uVar23 = 0x40000000;
          }
          if (0x3fffffff < (uVar6 | uVar9)) {
            uVar23 = 0x40000000;
          }
          (s->params).size_hint = uVar23;
        }
        iVar4 = EncodeData(s,(uint)bVar15,(uint)bVar3,out_size,&s->next_out_);
        if (iVar4 == 0) {
          return 0;
        }
        if ((bVar3 | bVar15) == 1) {
          s->stream_state_ = bVar15 + BROTLI_STREAM_FLUSH_REQUESTED;
        }
      }
    } while (s->flint_ != -1);
    if (s->stream_state_ != BROTLI_STREAM_PROCESSING) {
      if ((s->stream_state_ != BROTLI_STREAM_FLUSH_REQUESTED) || (*out_size != 0))
      goto LAB_01cf6595;
      s->stream_state_ = BROTLI_STREAM_PROCESSING;
      s->next_out_ = (uint8_t *)0x0;
    }
    s->flint_ = -2;
    goto LAB_01cf6595;
  }
  uVar23 = 1L << ((byte)(s->params).lgwin & 0x3f);
  uVar9 = *available_in;
  uVar6 = uVar23;
  if (uVar9 < uVar23) {
    uVar6 = uVar9;
  }
  n = 0x20000;
  if (uVar6 < 0x20000) {
    n = uVar6;
  }
  if (uVar21 != 1) {
    local_68 = (uint8_t *)0x0;
    local_78 = (uint8_t *)0x0;
    local_70 = (uint32_t *)0x0;
    local_80 = (uint32_t *)0x0;
    goto LAB_01cf6b62;
  }
  local_70 = s->command_buf_;
  if (uVar6 < 0x20000 || local_70 != (uint32_t *)0x0) {
    if (local_70 != (uint32_t *)0x0) {
      local_68 = s->literal_buf_;
      local_78 = (uint8_t *)0x0;
      local_80 = (uint32_t *)0x0;
      goto LAB_01cf6b62;
    }
    if (uVar9 != 0) goto LAB_01cf6b26;
    local_68 = (uint8_t *)0x0;
    local_70 = (uint32_t *)0x0;
  }
  else {
    puVar10 = (uint32_t *)BrotliAllocate(m,0x80000);
    s->command_buf_ = puVar10;
    local_68 = (uint8_t *)BrotliAllocate(m,0x20000);
    s->literal_buf_ = local_68;
    local_70 = s->command_buf_;
    if (local_70 == (uint32_t *)0x0) {
LAB_01cf6b26:
      local_80 = (uint32_t *)BrotliAllocate(m,n * 4);
      local_78 = (uint8_t *)BrotliAllocate(m,n);
      local_70 = local_80;
      local_68 = local_78;
      goto LAB_01cf6b62;
    }
  }
  local_78 = (uint8_t *)0x0;
  local_80 = (uint32_t *)0x0;
LAB_01cf6b62:
  local_40 = op - BROTLI_OPERATION_FLUSH;
  local_3c = (op == BROTLI_OPERATION_FINISH) + BROTLI_STREAM_FLUSH_REQUESTED;
LAB_01cf6b83:
  do {
    iVar4 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
  } while (iVar4 != 0);
  if (((s->available_out_ != 0) || (s->stream_state_ != BROTLI_STREAM_PROCESSING)) ||
     (uVar9 = *available_in, op == BROTLI_OPERATION_PROCESS && uVar9 == 0)) {
    BrotliFree(m,local_80);
    BrotliFree(m,local_78);
    if (s->stream_state_ != BROTLI_STREAM_FLUSH_REQUESTED) {
      return 1;
    }
    if (s->available_out_ != 0) {
      return 1;
    }
LAB_01cf6dcd:
    s->stream_state_ = BROTLI_STREAM_PROCESSING;
    s->next_out_ = (uint8_t *)0x0;
    return 1;
  }
  uVar6 = uVar9;
  if (uVar9 > uVar23) {
    uVar6 = uVar23;
  }
  storage_ix = (size_t)s->last_bytes_bits_;
  BVar5 = BROTLI_STREAM_FLUSH_REQUESTED;
  if (op != BROTLI_OPERATION_FLUSH || uVar9 != 0) goto code_r0x01cf6c12;
  goto LAB_01cf6d81;
code_r0x01cf6c12:
  uVar19 = uVar6 * 2 + 0x1f7;
  uVar24 = *available_out;
  if (uVar24 < uVar19) {
    puVar12 = GetBrotliStorage(s,uVar19);
  }
  else {
    puVar12 = *next_out;
  }
  uVar21 = (uint)(op == BROTLI_OPERATION_FINISH && uVar9 <= uVar23);
  *puVar12 = (uint8_t)s->last_bytes_;
  puVar12[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
  table = GetHashTable(s,(s->params).quality,uVar6,&local_38);
  if ((s->params).quality == 0) {
    BrotliCompressFragmentFast
              (s->one_pass_arena_,*next_in,uVar6,uVar21,table,local_38,&storage_ix,puVar12);
  }
  else {
    BrotliCompressFragmentTwoPass
              (s->two_pass_arena_,*next_in,uVar6,uVar21,local_70,local_68,table,local_38,&storage_ix
               ,puVar12);
  }
  if (uVar9 != 0) {
    *next_in = *next_in + uVar6;
    *available_in = *available_in - uVar6;
    s->total_in_ = s->total_in_ + uVar6;
  }
  uVar6 = storage_ix >> 3;
  if (uVar24 < uVar19) {
    s->next_out_ = puVar12;
    s->available_out_ = uVar6;
  }
  else {
    *next_out = *next_out + uVar6;
    *available_out = *available_out - uVar6;
    uVar20 = s->total_out_ + uVar6;
    s->total_out_ = uVar20;
    if (total_out != (size_t *)0x0) {
      *total_out = uVar20;
    }
  }
  s->last_bytes_ = (ushort)puVar12[uVar6];
  s->last_bytes_bits_ = (byte)storage_ix & 7;
  BVar5 = local_3c;
  if (local_40 < 2 && uVar9 <= uVar23) {
LAB_01cf6d81:
    s->stream_state_ = BVar5;
  }
  goto LAB_01cf6b83;
}

Assistant:

BROTLI_BOOL duckdb_brotli::BrotliEncoderCompressStream(
    BrotliEncoderState* s, BrotliEncoderOperation op, size_t* available_in,
    const uint8_t** next_in, size_t* available_out, uint8_t** next_out,
    size_t* total_out) {
  if (!EnsureInitialized(s)) return BROTLI_FALSE;

  /* Unfinished metadata block; check requirements. */
  if (s->remaining_metadata_bytes_ != BROTLI_UINT32_MAX) {
    if (*available_in != s->remaining_metadata_bytes_) return BROTLI_FALSE;
    if (op != BROTLI_OPERATION_EMIT_METADATA) return BROTLI_FALSE;
  }

  if (op == BROTLI_OPERATION_EMIT_METADATA) {
    UpdateSizeHint(s, 0);  /* First data metablock might be emitted here. */
    return ProcessMetadata(
        s, available_in, next_in, available_out, next_out, total_out);
  }

  if (s->stream_state_ == BROTLI_STREAM_METADATA_HEAD ||
      s->stream_state_ == BROTLI_STREAM_METADATA_BODY) {
    return BROTLI_FALSE;
  }

  if (s->stream_state_ != BROTLI_STREAM_PROCESSING && *available_in != 0) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    return BrotliEncoderCompressStreamFast(s, op, available_in, next_in,
        available_out, next_out, total_out);
  }
  while (BROTLI_TRUE) {
    size_t remaining_block_size = RemainingInputBlockSize(s);
    /* Shorten input to flint size. */
    if (s->flint_ >= 0 && remaining_block_size > (size_t)s->flint_) {
      remaining_block_size = (size_t)s->flint_;
    }

    if (remaining_block_size != 0 && *available_in != 0) {
      size_t copy_input_size =
          BROTLI_MIN(size_t, remaining_block_size, *available_in);
      CopyInputToRingBuffer(s, copy_input_size, *next_in);
      *next_in += copy_input_size;
      *available_in -= copy_input_size;
      s->total_in_ += copy_input_size;
      if (s->flint_ > 0) s->flint_ = (int8_t)(s->flint_ - (int)copy_input_size);
      continue;
    }

    if (InjectFlushOrPushOutput(s, available_out, next_out, total_out)) {
      /* Exit the "emit flint" workflow. */
      if (s->flint_ == BROTLI_FLINT_WAITING_FOR_FLUSHING) {
        CheckFlushComplete(s);
        if (s->stream_state_ == BROTLI_STREAM_PROCESSING) {
          s->flint_ = BROTLI_FLINT_DONE;
        }
      }
      continue;
    }

    /* Compress data only when internal output buffer is empty, stream is not
       finished and there is no pending flush request. */
    if (s->available_out_ == 0 &&
        s->stream_state_ == BROTLI_STREAM_PROCESSING) {
      if (remaining_block_size == 0 || op != BROTLI_OPERATION_PROCESS) {
        BROTLI_BOOL is_last = TO_BROTLI_BOOL(
            (*available_in == 0) && op == BROTLI_OPERATION_FINISH);
        BROTLI_BOOL force_flush = TO_BROTLI_BOOL(
            (*available_in == 0) && op == BROTLI_OPERATION_FLUSH);
        BROTLI_BOOL result;
        /* Force emitting (uncompressed) piece containing flint. */
        if (!is_last && s->flint_ == 0) {
          s->flint_ = BROTLI_FLINT_WAITING_FOR_FLUSHING;
          force_flush = BROTLI_TRUE;
        }
        UpdateSizeHint(s, *available_in);
        result = EncodeData(s, is_last, force_flush,
            &s->available_out_, &s->next_out_);
        if (!result) return BROTLI_FALSE;
        if (force_flush) s->stream_state_ = BROTLI_STREAM_FLUSH_REQUESTED;
        if (is_last) s->stream_state_ = BROTLI_STREAM_FINISHED;
        continue;
      }
    }
    break;
  }
  CheckFlushComplete(s);
  return BROTLI_TRUE;
}